

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O0

void QUnicodeTools::initScripts(QStringView string,ScriptItemArray *scripts)

{
  char16_t high;
  char16_t low_00;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  qsizetype qVar4;
  char16_t *pcVar5;
  Properties *pPVar6;
  long in_FS_OFFSET;
  Script nscript;
  Properties *prop;
  ushort low;
  char32_t ucs4;
  qsizetype i;
  Script script;
  qsizetype eor;
  qsizetype sor;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  QVarLengthArray<QUnicodeTools::ScriptItem,_64LL> *in_stack_ffffffffffffff70;
  QStringView *this;
  QStringView *local_68;
  uint local_5c;
  QStringView *local_58;
  QChar local_1c;
  QChar local_1a;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QStringView *)0x0;
  local_5c = 2;
  while (this = local_58, qVar4 = QStringView::size(&local_18), (long)this < qVar4) {
    local_1a = QStringView::operator[](this,(qsizetype)in_stack_ffffffffffffff70);
    pcVar5 = QChar::unicode(&local_1a);
    high = *pcVar5;
    bVar2 = QChar::isHighSurrogate((uint)(ushort)high);
    local_68 = local_58;
    if (bVar2) {
      in_stack_ffffffffffffff70 =
           (QVarLengthArray<QUnicodeTools::ScriptItem,_64LL> *)((long)&local_58->m_size + 1);
      qVar4 = QStringView::size(&local_18);
      if ((long)in_stack_ffffffffffffff70 < qVar4) {
        local_1c = QStringView::operator[](this,(qsizetype)in_stack_ffffffffffffff70);
        pcVar5 = QChar::unicode(&local_1c);
        low_00 = *pcVar5;
        bVar2 = QChar::isLowSurrogate((uint)(ushort)low_00);
        if (bVar2) {
          QChar::surrogateToUcs4(high,low_00);
          local_68 = (QStringView *)((long)&local_58->m_size + 1);
        }
      }
    }
    pPVar6 = QUnicodeTables::properties(L'\0');
    uVar3 = *(uint *)&pPVar6->field_0x10 >> 0x18;
    in_stack_ffffffffffffff6f = uVar3 == local_5c || uVar3 < 3;
    uVar1 = local_5c;
    if (((uVar3 != local_5c && uVar3 >= 3) && (uVar1 = uVar3, 2 < local_5c)) &&
       (uVar1 = local_5c, (1 << ((byte)*(undefined8 *)pPVar6 & 0x1f) & 7U) == 0)) {
      QVarLengthArray<QUnicodeTools::ScriptItem,_64LL>::append
                (in_stack_ffffffffffffff70,
                 (ScriptItem *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      uVar1 = uVar3;
    }
    local_5c = uVar1;
    local_58 = (QStringView *)((long)&local_68->m_size + 1);
  }
  QVarLengthArray<QUnicodeTools::ScriptItem,_64LL>::append
            (in_stack_ffffffffffffff70,
             (ScriptItem *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_CORE_EXPORT void initScripts(QStringView string, ScriptItemArray *scripts)
{
    qsizetype sor = 0;
    qsizetype eor = 0;
    QChar::Script script = QChar::Script_Common;

    for (qsizetype i = 0; i < string.size(); ++i, eor = i) {
        char32_t ucs4 = string[i].unicode();
        if (QChar::isHighSurrogate(ucs4) && i + 1 < string.size()) {
            ushort low = string[i + 1].unicode();
            if (QChar::isLowSurrogate(low)) {
                ucs4 = QChar::surrogateToUcs4(ucs4, low);
                ++i;
            }
        }

        const QUnicodeTables::Properties *prop = QUnicodeTables::properties(ucs4);

        QChar::Script nscript = QChar::Script(prop->script);

        if (Q_LIKELY(nscript == script || nscript <= QChar::Script_Common))
            continue;

        // inherit preceding Common-s
        if (Q_UNLIKELY(script <= QChar::Script_Common)) {
            // also covers a case where the base character of Common script followed
            // by one or more combining marks of non-Inherited, non-Common script
            script = nscript;
            continue;
        }

        // Never break between a combining mark (gc= Mc, Mn or Me) and its base character.
        // Thus, a combining mark - whatever its script property value is - should inherit
        // the script property value of its base character.
        static const int test = (FLAG(QChar::Mark_NonSpacing) | FLAG(QChar::Mark_SpacingCombining) | FLAG(QChar::Mark_Enclosing));
        if (Q_UNLIKELY(FLAG(prop->category) & test))
            continue;

        Q_ASSERT(script > QChar::Script_Common);
        Q_ASSERT(sor < eor);
        scripts->append(ScriptItem{sor, script});
        sor = eor;

        script = nscript;
    }

    Q_ASSERT(script >= QChar::Script_Common);
    Q_ASSERT(eor == string.size());
    scripts->append(ScriptItem{sor, script});
}